

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_reverse_value(lyd_node *node,lys_module *mod)

{
  LY_ERR LVar1;
  char *__s;
  ly_ctx *local_68;
  lyd_any_value local_60;
  lyd_any_value anyval;
  char *pcStack_50;
  LY_ERR ret__;
  char *__path;
  char *pcStack_40;
  uint32_t flags;
  char *val2;
  char *val1;
  lyd_meta *meta;
  lys_module *plStack_20;
  LY_ERR ret;
  lys_module *mod_local;
  lyd_node *node_local;
  
  meta._4_4_ = 0;
  val2 = (char *)0x0;
  plStack_20 = mod;
  mod_local = (lys_module *)node;
  if ((node->schema->nodetype & 100) == 0) {
    __assert_fail("node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x848,
                  "LY_ERR lyd_diff_reverse_value(struct lyd_node *, const struct lys_module *)");
  }
  val1 = (char *)lyd_find_meta(node->meta,mod,"orig-value");
  if ((lyd_meta *)val1 == (lyd_meta *)0x0) {
    pcStack_50 = lyd_path((lyd_node *)mod_local,LYD_PATH_STD,(char *)0x0,0);
    if (mod_local->name == (char *)0x0) {
      local_68 = *(ly_ctx **)&mod_local->implemented;
    }
    else {
      local_68 = (ly_ctx *)**(undefined8 **)(mod_local->name + 8);
    }
    ly_log(local_68,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
           "orig-value",pcStack_50);
    free(pcStack_50);
    node_local._4_4_ = LY_EINVAL;
  }
  else {
    val2 = lyd_get_meta_value((lyd_meta *)val1);
    if (*(short *)mod_local->name == 4) {
      __s = lyd_get_value((lyd_node *)mod_local);
      pcStack_40 = strdup(__s);
    }
    else {
      LVar1 = lyd_any_value_str((lyd_node *)mod_local,&stack0xffffffffffffffc0);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      anyval._4_4_ = 0;
    }
    __path._4_4_ = *(undefined4 *)((long)&mod_local->ctx + 4);
    if (*(short *)mod_local->name == 4) {
      meta._4_4_ = lyd_change_term((lyd_node *)mod_local,val2);
    }
    else {
      local_60.str = val2;
      meta._4_4_ = lyd_any_copy_value((lyd_node *)mod_local,&local_60,LYD_ANYDATA_STRING);
    }
    if (meta._4_4_ == LY_SUCCESS) {
      meta._4_4_ = 0;
      *(undefined4 *)((long)&mod_local->ctx + 4) = __path._4_4_;
      meta._4_4_ = lyd_change_meta((lyd_meta *)val1,pcStack_40);
    }
    free(pcStack_40);
    node_local._4_4_ = meta._4_4_;
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
lyd_diff_reverse_value(struct lyd_node *node, const struct lys_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *meta;
    const char *val1 = NULL;
    char *val2;
    uint32_t flags;

    assert(node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA));

    meta = lyd_find_meta(node->meta, mod, "orig-value");
    LY_CHECK_ERR_RET(!meta, LOGERR_META(LYD_CTX(node), "orig-value", node), LY_EINVAL);

    /* orig-value */
    val1 = lyd_get_meta_value(meta);

    /* current value */
    if (node->schema->nodetype == LYS_LEAF) {
        val2 = strdup(lyd_get_value(node));
    } else {
        LY_CHECK_RET(lyd_any_value_str(node, &val2));
    }

    /* switch values, keep default flag */
    flags = node->flags;
    if (node->schema->nodetype == LYS_LEAF) {
        LY_CHECK_GOTO(ret = lyd_change_term(node, val1), cleanup);
    } else {
        union lyd_any_value anyval = {.str = val1};

        LY_CHECK_GOTO(ret = lyd_any_copy_value(node, &anyval, LYD_ANYDATA_STRING), cleanup);
    }
    node->flags = flags;
    LY_CHECK_GOTO(ret = lyd_change_meta(meta, val2), cleanup);

cleanup:
    free(val2);
    return ret;
}